

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_FieldFeaturesOverride_Test::
~FeaturesTest_FieldFeaturesOverride_Test(FeaturesTest_FieldFeaturesOverride_Test *this)

{
  FeaturesTest_FieldFeaturesOverride_Test *this_local;
  
  ~FeaturesTest_FieldFeaturesOverride_Test(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(FeaturesTest, FieldFeaturesOverride) {
  BuildDescriptorMessagesInTestPool();
  BuildFileInTestPool(pb::TestFeatures::descriptor()->file());
  const FileDescriptor* file = BuildFile(R"pb(
    name: "foo.proto"
    syntax: "editions"
    edition: EDITION_2023
    dependency: "google/protobuf/unittest_features.proto"
    options {
      features {
        enum_type: CLOSED
        field_presence: IMPLICIT
        [pb.test] { multiple_feature: VALUE2 }
      }
    }
    message_type {
      name: "Foo"
      options {
        features {
          [pb.test] { multiple_feature: VALUE3 }
        }
      }
      field {
        name: "bar"
        number: 1
        label: LABEL_OPTIONAL
        type: TYPE_STRING
        options {
          features {
            field_presence: EXPLICIT
            [pb.test] { multiple_feature: VALUE9 }
          }
        }
      }
    }
  )pb");
  const FieldDescriptor* field = file->message_type(0)->field(0);
  EXPECT_THAT(field->options(), EqualsProto(""));
  EXPECT_EQ(GetFeatures(field).field_presence(), FeatureSet::EXPLICIT);
  EXPECT_EQ(GetFeatures(field).enum_type(), FeatureSet::CLOSED);
  EXPECT_EQ(GetFeatures(field).GetExtension(pb::test).multiple_feature(),
            pb::VALUE9);
}